

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

int __thiscall obx::ExpiredObjects::remove(ExpiredObjects *this,char *__filename)

{
  obx_err err;
  OBX_txn *pOVar1;
  undefined4 in_EDX;
  size_t removedCount;
  undefined8 local_18;
  
  local_18 = 0;
  pOVar1 = Transaction::cPtr((Transaction *)__filename);
  err = obx_expired_objects_remove(pOVar1,in_EDX,&local_18);
  internal::checkErrOrThrow(err);
  return (int)local_18;
}

Assistant:

size_t ExpiredObjects::remove(obx::Transaction& tx, obx_schema_id typeId) {
    size_t removedCount = 0;
    obx_err err = obx_expired_objects_remove(tx.cPtr(), typeId, &removedCount);
    internal::checkErrOrThrow(err);
    return removedCount;
}